

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

void pugi::impl::anon_unknown_0::remove_node(xml_node_struct *node)

{
  xml_node_struct *pxVar1;
  xml_node_struct *pxVar2;
  xml_node_struct *pxVar3;
  xml_node_struct *prev;
  xml_node_struct *next;
  xml_node_struct *parent;
  xml_node_struct *node_local;
  
  pxVar1 = node->parent;
  pxVar2 = node->next_sibling;
  pxVar3 = node->prev_sibling_c;
  if (pxVar2 == (xml_node_struct *)0x0) {
    pxVar1->first_child->prev_sibling_c = pxVar3;
  }
  else {
    pxVar2->prev_sibling_c = pxVar3;
  }
  if (pxVar3->next_sibling == (xml_node_struct *)0x0) {
    pxVar1->first_child = pxVar2;
  }
  else {
    pxVar3->next_sibling = pxVar2;
  }
  node->parent = (xml_node_struct *)0x0;
  node->prev_sibling_c = (xml_node_struct *)0x0;
  node->next_sibling = (xml_node_struct *)0x0;
  return;
}

Assistant:

inline void remove_node(xml_node_struct* node)
	{
		xml_node_struct* parent = node->parent;

		xml_node_struct* next = node->next_sibling;
		xml_node_struct* prev = node->prev_sibling_c;

		if (next)
			next->prev_sibling_c = prev;
		else
			parent->first_child->prev_sibling_c = prev;

		if (prev->next_sibling)
			prev->next_sibling = next;
		else
			parent->first_child = next;

		node->parent = NULL;
		node->prev_sibling_c = NULL;
		node->next_sibling = NULL;
	}